

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void av1_read_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r,int x_mis,int y_mis)

{
  undefined1 *puVar1;
  AV1_COMMON *cm;
  nmv_context *icdf;
  aom_cdf_prob *paVar2;
  BLOCK_SIZE bsize;
  ushort uVar3;
  ushort uVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *pMVar6;
  FRAME_CONTEXT *pFVar7;
  SequenceHeader *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int8_t iVar38;
  UV_PREDICTION_MODE UVar39;
  uint8_t uVar40;
  undefined1 uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  MV_REF *mv;
  MV_REF *pMVar45;
  byte bVar46;
  byte bVar47;
  int_mv iVar48;
  int iVar49;
  long lVar50;
  ulong uVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  int_mv iVar56;
  bool cfl_allowed;
  undefined1 auVar57 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar79;
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar97;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int_mv local_c4;
  ulong local_c0;
  ulong local_b8;
  FRAME_CONTEXT *local_b0;
  od_ec_dec *local_a8;
  MB_MODE_INFO *local_a0;
  MB_MODE_INFO *local_98;
  ulong local_90;
  int_mv nearestmv;
  int_mv ref_mvs [1] [2];
  int16_t inter_mode_ctx [29];
  
  local_90 = (ulong)(uint)x_mis;
  pMVar5 = *(dcb->xd).mi;
  puVar1 = &pMVar5->field_0xa7;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
  cm = &pbi->common;
  if (((pbi->common).current_frame.frame_type & 0xfd) != 0) {
    read_inter_frame_mode_info(pbi,dcb,r);
    if ((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs == 0) {
      return;
    }
    av1_copy_frame_mvs(cm,pMVar5,(dcb->xd).mi_row,(dcb->xd).mi_col,x_mis,y_mis);
    return;
  }
  local_98 = (dcb->xd).left_mbmi;
  pMVar5 = *(dcb->xd).mi;
  local_a0 = (dcb->xd).above_mbmi;
  bsize = pMVar5->bsize;
  ec_ctx = (dcb->xd).tile_ctx;
  if ((pbi->common).seg.segid_preskip != '\0') {
    iVar42 = read_intra_segment_id(cm,&dcb->xd,bsize,r,0);
    *(ushort *)&pMVar5->field_0xa7 = *(ushort *)&pMVar5->field_0xa7 & 0xfff8 | (ushort)iVar42 & 7;
  }
  uVar43 = read_skip_txfm(cm,&dcb->xd,*(ushort *)&pMVar5->field_0xa7 & 7,r);
  pMVar5->skip_txfm = (uint8_t)uVar43;
  if ((pbi->common).seg.segid_preskip == '\0') {
    iVar42 = read_intra_segment_id(cm,&dcb->xd,bsize,r,uVar43 & 0xff);
    *(ushort *)&pMVar5->field_0xa7 = *(ushort *)&pMVar5->field_0xa7 & 0xfff8 | (ushort)iVar42 & 7;
  }
  read_cdef(cm,r,&dcb->xd);
  read_delta_q_params(cm,&dcb->xd,r);
  pMVar5->current_qindex = (dcb->xd).current_base_qindex;
  pMVar5->ref_frame[0] = '\0';
  pMVar5->ref_frame[1] = -1;
  (pMVar5->palette_mode_info).palette_size[0] = '\0';
  (pMVar5->palette_mode_info).palette_size[1] = '\0';
  (pMVar5->filter_intra_mode_info).use_filter_intra = '\0';
  (dcb->xd).above_txfm_context =
       (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
  (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
  if (((((pbi->common).current_frame.frame_type & 0xfd) == 0) &&
      ((pbi->common).features.allow_screen_content_tools == true)) &&
     ((pbi->common).features.allow_intrabc != false)) {
    pMVar6 = *(dcb->xd).mi;
    pFVar7 = (dcb->xd).tile_ctx;
    local_a8 = &r->ec;
    uVar43 = od_ec_decode_cdf_q15(local_a8,pFVar7->intrabc_cdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar3 = pFVar7->intrabc_cdf[2];
      bVar46 = (char)(uVar3 >> 4) + 4;
      uVar4 = pFVar7->intrabc_cdf[0];
      if ((char)uVar43 < '\x01') {
        sVar30 = -(uVar4 >> (bVar46 & 0x1f));
      }
      else {
        sVar30 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar46 & 0x1f));
      }
      pFVar7->intrabc_cdf[0] = sVar30 + uVar4;
      pFVar7->intrabc_cdf[2] = uVar3 + (uVar3 < 0x20);
    }
    *(ushort *)&pMVar6->field_0xa7 =
         *(ushort *)&pMVar6->field_0xa7 & 0xff7f | (ushort)(byte)(uVar43 << 7);
    if ((uVar43 & 1) != 0) {
      uVar51 = (ulong)pMVar6->bsize;
      pMVar6->mode = '\0';
      pMVar6->uv_mode = '\0';
      (pMVar6->interp_filters).as_int = 0x30003;
      pMVar6->motion_mode = '\0';
      av1_find_mv_refs(cm,&dcb->xd,pMVar6,'\0',dcb->ref_mv_count,(dcb->xd).ref_mv_stack,
                       (dcb->xd).weight,(int_mv (*) [2])ref_mvs[0],(int_mv *)0x0,inter_mode_ctx);
      av1_find_best_ref_mvs(0,ref_mvs[0],&nearestmv,&local_c4,0);
      if (nearestmv.as_int == 0) {
        nearestmv = local_c4;
      }
      if (nearestmv.as_int == 0) {
        iVar42 = ((pbi->common).seq_params)->mib_size;
        iVar56.as_int = iVar42 * -0x20;
        iVar48.as_int = 0;
        if ((dcb->xd).mi_row - iVar42 < (dcb->xd).tile.mi_row_start) {
          iVar56.as_int = iVar48.as_int;
          iVar48.as_int = iVar42 * -0x20 - 0x800;
        }
      }
      else {
        iVar56 = nearestmv;
        iVar48.as_int = nearestmv.as_int >> 0x10;
      }
      if (((iVar48.as_int | iVar56.as_int) & 7) == 0) {
        local_b8 = (ulong)(uint)(dcb->xd).mi_row;
        local_c0 = (ulong)(uint)(dcb->xd).mi_col;
        pFVar7 = (dcb->xd).tile_ctx;
        icdf = &pFVar7->ndvc;
        iVar42 = od_ec_decode_cdf_q15(local_a8,icdf->joints_cdf,4);
        bVar46 = (byte)iVar42;
        if (r->allow_update_cdf != '\0') {
          uVar3 = (pFVar7->ndvc).joints_cdf[4];
          bVar47 = (char)(uVar3 >> 4) + 5;
          lVar50 = 0;
          do {
            uVar4 = icdf->joints_cdf[lVar50];
            if (lVar50 < (char)bVar46) {
              sVar30 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar47 & 0x1f));
            }
            else {
              sVar30 = -(uVar4 >> (bVar47 & 0x1f));
            }
            icdf->joints_cdf[lVar50] = sVar30 + uVar4;
            lVar50 = lVar50 + 1;
          } while (lVar50 != 3);
          paVar2 = (pFVar7->ndvc).joints_cdf + 4;
          *paVar2 = *paVar2 + (ushort)(uVar3 < 0x20);
        }
        local_b0 = pFVar7;
        if ((bVar46 & 0xfe) == 2) {
          iVar42 = read_mv_component(r,(pFVar7->ndvc).comps,0,0);
        }
        else {
          iVar42 = 0;
        }
        if ((bVar46 & 0xfd) == 1) {
          iVar44 = read_mv_component(r,(local_b0->ndvc).comps + 1,0,0);
        }
        else {
          iVar44 = 0;
        }
        uVar43 = iVar44 + iVar48.as_int & 0xfff8;
        pMVar6->mv[0].as_mv.col = (int16_t)uVar43;
        uVar55 = iVar42 + (iVar56.as_int & 0xfff8) & 0xfff8;
        pMVar6->mv[0].as_mv.row = (int16_t)uVar55;
        if (((0x8000 < (uVar55 - 0x4000 & 0xffff)) && (0x8000 < (uVar43 - 0x4000 & 0xffff))) &&
           ((uVar43 = pMVar6->mv[0].as_int, (uVar43 & 7) == 0 && ((uVar43 & 0x70000) == 0)))) {
          iVar42 = (int)local_b8 * 0x20 + (int)(short)uVar43;
          iVar44 = (dcb->xd).tile.mi_row_start * 0x20;
          if (iVar44 <= iVar42) {
            iVar53 = (int)local_c0 * 0x20 + ((int)uVar43 >> 0x10);
            uVar43 = (dcb->xd).tile.mi_col_start;
            iVar54 = uVar43 * 0x20;
            if ((iVar54 <= iVar53) &&
               (iVar49 = iVar42 + (uint)block_size_high[uVar51] * 8,
               iVar49 <= (dcb->xd).tile.mi_row_end * 0x20)) {
              iVar52 = iVar53 + (uint)block_size_wide[uVar51] * 8;
              iVar79 = (dcb->xd).tile.mi_col_end;
              if (iVar52 <= iVar79 * 0x20) {
                pSVar8 = (pbi->common).seq_params;
                if ((((dcb->xd).is_chroma_ref != true) || (pSVar8->monochrome != '\0')) ||
                   ((((0x10003UL >> (uVar51 & 0x3f) & 1) == 0 ||
                     (((dcb->xd).plane[1].subsampling_x == 0 || (iVar54 + 0x20 <= iVar53)))) &&
                    (((0x20005UL >> (uVar51 & 0x3f) & 1) == 0 ||
                     (((dcb->xd).plane[1].subsampling_y == 0 || (iVar44 + 0x20 <= iVar42)))))))) {
                  bVar46 = (byte)pSVar8->mib_size_log2;
                  iVar53 = (int)local_b8 >> (bVar46 & 0x1f);
                  iVar44 = 4 << (bVar46 & 0x1f);
                  iVar42 = ((iVar49 >> 3) + -1) / iVar44;
                  if (iVar42 <= iVar53) {
                    iVar54 = (int)local_c0 >> 4;
                    iVar49 = (iVar52 >> 3) + -1 >> 6;
                    iVar52 = ((int)(iVar79 + ~uVar43) >> 4) + 1;
                    if ((iVar42 * iVar52 + iVar49 < iVar54 + iVar53 * iVar52 + -4) &&
                       (iVar49 < (int)((iVar53 - iVar42) * ((0x40 < iVar44) + 5) + iVar54 + -4)))
                    goto LAB_00178336;
                  }
                }
              }
            }
          }
        }
      }
      aom_internal_error((dcb->xd).error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid intrabc dv");
    }
LAB_00178336:
    if ((pMVar5->field_0xa7 & 0x80) != 0) goto LAB_001784db;
  }
  bVar46 = av1_above_block_mode(local_a0);
  bVar47 = av1_left_block_mode(local_98);
  bVar46 = read_intra_mode(r,ec_ctx->kf_y_cdf[intra_mode_context[bVar46]]
                             [intra_mode_context[bVar47]]);
  pMVar5->mode = bVar46;
  iVar38 = '\0';
  if ((BLOCK_8X4 < bsize) && (iVar38 = '\0', 0xf7 < (byte)(bVar46 - 9))) {
    iVar42 = read_angle_delta(r,ec_ctx->angle_delta_cdf[(ulong)bVar46 - 1]);
    iVar38 = (int8_t)iVar42;
  }
  pMVar5->angle_delta[0] = iVar38;
  lVar50 = 3;
  if ((((pbi->common).seq_params)->monochrome == '\0') && ((dcb->xd).is_chroma_ref == true)) {
    pMVar6 = *(dcb->xd).mi;
    uVar51 = (ulong)pMVar6->bsize;
    if ((dcb->xd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) {
      cfl_allowed = (0x2f0bffUL >> (uVar51 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar51 & 0x3f) & 1) == 0) {
        cfl_allowed = false;
      }
    }
    else {
      cfl_allowed = av1_ss_size_lookup[uVar51][(dcb->xd).plane[1].subsampling_x]
                    [(dcb->xd).plane[1].subsampling_y] == BLOCK_4X4;
    }
    UVar39 = read_intra_mode_uv(ec_ctx,r,cfl_allowed,pMVar5->mode);
    pMVar5->uv_mode = UVar39;
    if (UVar39 == '\r') {
      uVar40 = read_cfl_alphas(ec_ctx,r,&pMVar5->cfl_alpha_signs);
      pMVar5->cfl_alpha_idx = uVar40;
    }
    uVar41 = 0;
    lVar50 = 0x59;
    if ((BLOCK_8X4 < bsize) && (0xf7 < (byte)(get_uv_mode_uv2y[pMVar5->uv_mode] - 9))) {
      iVar42 = read_angle_delta(r,ec_ctx->angle_delta_cdf
                                  [(ulong)(byte)get_uv_mode_uv2y[pMVar5->uv_mode] - 1]);
      uVar41 = (undefined1)iVar42;
    }
  }
  else {
    uVar41 = 0;
  }
  *(undefined1 *)((long)pMVar5->mv + lVar50 + -8) = uVar41;
  if (((pbi->common).seq_params)->monochrome == '\0') {
    uVar43 = 1;
    if ((dcb->xd).is_chroma_ref == true) {
      pMVar5 = *(dcb->xd).mi;
      if ((pMVar5->field_0xa7 & 0x80) == 0) {
        uVar43 = 0;
        if (pMVar5->ref_frame[0] < '\x01') {
          uVar43 = (uint)(pMVar5->uv_mode == '\r');
        }
      }
      else {
        uVar43 = 0;
      }
    }
  }
  else {
    uVar43 = 0;
  }
  (dcb->xd).cfl.store_y = uVar43;
  if (((pbi->common).features.allow_screen_content_tools != false) &&
     ((0xf < bsize || ((0xe007U >> (bsize & 0x1f) & 1) == 0)))) {
    read_palette_mode_info(cm,&dcb->xd,r);
  }
  read_filter_intra_mode_info(cm,&dcb->xd,r);
LAB_001784db:
  auVar37 = _DAT_004d3fc0;
  auVar36 = _DAT_004d3fb0;
  auVar35 = _DAT_004d2130;
  auVar34 = _DAT_004d2120;
  auVar33 = _DAT_004d0530;
  auVar32 = _DAT_004d0520;
  auVar31 = _DAT_004d0510;
  if (((((pbi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) &&
     (iVar42 = y_mis + 1 >> 1, 0 < iVar42)) {
    uVar43 = (int)local_90 + 1 >> 1;
    iVar44 = (pbi->common).mi_params.mi_cols + 1 >> 1;
    pMVar45 = ((pbi->common).cur_frame)->mvs +
              (long)(((dcb->xd).mi_row >> 1) * iVar44) + (long)((dcb->xd).mi_col >> 1);
    lVar50 = (ulong)uVar43 - 1;
    auVar57._8_4_ = (int)lVar50;
    auVar57._0_8_ = lVar50;
    auVar57._12_4_ = (int)((ulong)lVar50 >> 0x20);
    iVar53 = 0;
    do {
      if (0 < (int)uVar43) {
        uVar51 = 0;
        do {
          auVar75._8_4_ = (int)uVar51;
          auVar75._0_8_ = uVar51;
          auVar75._12_4_ = (int)(uVar51 >> 0x20);
          auVar77 = auVar57 ^ auVar33;
          auVar80 = (auVar75 | auVar32) ^ auVar33;
          iVar54 = auVar77._0_4_;
          iVar93 = -(uint)(iVar54 < auVar80._0_4_);
          iVar49 = auVar77._4_4_;
          auVar82._4_4_ = -(uint)(iVar49 < auVar80._4_4_);
          iVar52 = auVar77._8_4_;
          iVar97 = -(uint)(iVar52 < auVar80._8_4_);
          iVar79 = auVar77._12_4_;
          auVar82._12_4_ = -(uint)(iVar79 < auVar80._12_4_);
          auVar58._4_4_ = iVar93;
          auVar58._0_4_ = iVar93;
          auVar58._8_4_ = iVar97;
          auVar58._12_4_ = iVar97;
          auVar58 = pshuflw(in_XMM1,auVar58,0xe8);
          auVar81._4_4_ = -(uint)(auVar80._4_4_ == iVar49);
          auVar81._12_4_ = -(uint)(auVar80._12_4_ == iVar79);
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._12_4_;
          auVar67 = pshuflw(in_XMM2,auVar81,0xe8);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar80 = pshuflw(auVar58,auVar82,0xe8);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar77 = (auVar80 | auVar67 & auVar58) ^ auVar77;
          auVar77 = packssdw(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pMVar45[uVar51].ref_frame = -1;
          }
          auVar67._4_4_ = iVar93;
          auVar67._0_4_ = iVar93;
          auVar67._8_4_ = iVar97;
          auVar67._12_4_ = iVar97;
          auVar82 = auVar81 & auVar67 | auVar82;
          auVar77 = packssdw(auVar82,auVar82);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar80,auVar77 ^ auVar80);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._0_4_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 1].ref_frame = -1;
          }
          auVar77 = (auVar75 | auVar31) ^ auVar33;
          auVar68._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar68._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar68._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar68._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar83._4_4_ = auVar68._0_4_;
          auVar83._0_4_ = auVar68._0_4_;
          auVar83._8_4_ = auVar68._8_4_;
          auVar83._12_4_ = auVar68._8_4_;
          iVar93 = -(uint)(auVar77._4_4_ == iVar49);
          iVar97 = -(uint)(auVar77._12_4_ == iVar79);
          auVar18._4_4_ = iVar93;
          auVar18._0_4_ = iVar93;
          auVar18._8_4_ = iVar97;
          auVar18._12_4_ = iVar97;
          auVar94._4_4_ = auVar68._4_4_;
          auVar94._0_4_ = auVar68._4_4_;
          auVar94._8_4_ = auVar68._12_4_;
          auVar94._12_4_ = auVar68._12_4_;
          auVar77 = auVar18 & auVar83 | auVar94;
          auVar77 = packssdw(auVar77,auVar77);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar9,auVar77 ^ auVar9);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
            pMVar45[uVar51 + 2].ref_frame = -1;
          }
          auVar77 = pshufhw(auVar77,auVar83,0x84);
          auVar19._4_4_ = iVar93;
          auVar19._0_4_ = iVar93;
          auVar19._8_4_ = iVar97;
          auVar19._12_4_ = iVar97;
          auVar80 = pshufhw(auVar68,auVar19,0x84);
          auVar58 = pshufhw(auVar77,auVar94,0x84);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar58 | auVar80 & auVar77) ^ auVar59;
          auVar77 = packssdw(auVar59,auVar59);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._0_4_ >> 0x18 & 1) != 0) {
            pMVar45[uVar51 + 3].ref_frame = -1;
          }
          auVar77 = (auVar75 | auVar35) ^ auVar33;
          auVar69._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar69._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar69._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar69._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar20._4_4_ = auVar69._0_4_;
          auVar20._0_4_ = auVar69._0_4_;
          auVar20._8_4_ = auVar69._8_4_;
          auVar20._12_4_ = auVar69._8_4_;
          auVar80 = pshuflw(auVar94,auVar20,0xe8);
          auVar60._0_4_ = -(uint)(auVar77._0_4_ == iVar54);
          auVar60._4_4_ = -(uint)(auVar77._4_4_ == iVar49);
          auVar60._8_4_ = -(uint)(auVar77._8_4_ == iVar52);
          auVar60._12_4_ = -(uint)(auVar77._12_4_ == iVar79);
          auVar84._4_4_ = auVar60._4_4_;
          auVar84._0_4_ = auVar60._4_4_;
          auVar84._8_4_ = auVar60._12_4_;
          auVar84._12_4_ = auVar60._12_4_;
          auVar77 = pshuflw(auVar60,auVar84,0xe8);
          auVar85._4_4_ = auVar69._4_4_;
          auVar85._0_4_ = auVar69._4_4_;
          auVar85._8_4_ = auVar69._12_4_;
          auVar85._12_4_ = auVar69._12_4_;
          auVar58 = pshuflw(auVar69,auVar85,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 & auVar80,(auVar58 | auVar77 & auVar80) ^ auVar10);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 4].ref_frame = -1;
          }
          auVar21._4_4_ = auVar69._0_4_;
          auVar21._0_4_ = auVar69._0_4_;
          auVar21._8_4_ = auVar69._8_4_;
          auVar21._12_4_ = auVar69._8_4_;
          auVar85 = auVar84 & auVar21 | auVar85;
          auVar58 = packssdw(auVar85,auVar85);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77,auVar58 ^ auVar11);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._4_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 5].ref_frame = -1;
          }
          auVar77 = (auVar75 | auVar34) ^ auVar33;
          auVar70._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar70._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar70._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar70._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar86._4_4_ = auVar70._0_4_;
          auVar86._0_4_ = auVar70._0_4_;
          auVar86._8_4_ = auVar70._8_4_;
          auVar86._12_4_ = auVar70._8_4_;
          iVar93 = -(uint)(auVar77._4_4_ == iVar49);
          iVar97 = -(uint)(auVar77._12_4_ == iVar79);
          auVar22._4_4_ = iVar93;
          auVar22._0_4_ = iVar93;
          auVar22._8_4_ = iVar97;
          auVar22._12_4_ = iVar97;
          auVar95._4_4_ = auVar70._4_4_;
          auVar95._0_4_ = auVar70._4_4_;
          auVar95._8_4_ = auVar70._12_4_;
          auVar95._12_4_ = auVar70._12_4_;
          auVar77 = auVar22 & auVar86 | auVar95;
          auVar77 = packssdw(auVar77,auVar77);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar12,auVar77 ^ auVar12);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 6].ref_frame = -1;
          }
          auVar77 = pshufhw(auVar77,auVar86,0x84);
          auVar23._4_4_ = iVar93;
          auVar23._0_4_ = iVar93;
          auVar23._8_4_ = iVar97;
          auVar23._12_4_ = iVar97;
          auVar80 = pshufhw(auVar70,auVar23,0x84);
          auVar58 = pshufhw(auVar77,auVar95,0x84);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar58 | auVar80 & auVar77) ^ auVar61;
          auVar77 = packssdw(auVar61,auVar61);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._6_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 7].ref_frame = -1;
          }
          auVar77 = (auVar75 | auVar37) ^ auVar33;
          auVar71._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar71._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar71._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar71._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar24._4_4_ = auVar71._0_4_;
          auVar24._0_4_ = auVar71._0_4_;
          auVar24._8_4_ = auVar71._8_4_;
          auVar24._12_4_ = auVar71._8_4_;
          auVar80 = pshuflw(auVar95,auVar24,0xe8);
          auVar62._0_4_ = -(uint)(auVar77._0_4_ == iVar54);
          auVar62._4_4_ = -(uint)(auVar77._4_4_ == iVar49);
          auVar62._8_4_ = -(uint)(auVar77._8_4_ == iVar52);
          auVar62._12_4_ = -(uint)(auVar77._12_4_ == iVar79);
          auVar87._4_4_ = auVar62._4_4_;
          auVar87._0_4_ = auVar62._4_4_;
          auVar87._8_4_ = auVar62._12_4_;
          auVar87._12_4_ = auVar62._12_4_;
          auVar77 = pshuflw(auVar62,auVar87,0xe8);
          auVar88._4_4_ = auVar71._4_4_;
          auVar88._0_4_ = auVar71._4_4_;
          auVar88._8_4_ = auVar71._12_4_;
          auVar88._12_4_ = auVar71._12_4_;
          auVar58 = pshuflw(auVar71,auVar88,0xe8);
          auVar72._8_4_ = 0xffffffff;
          auVar72._0_8_ = 0xffffffffffffffff;
          auVar72._12_4_ = 0xffffffff;
          auVar72 = (auVar58 | auVar77 & auVar80) ^ auVar72;
          auVar58 = packssdw(auVar72,auVar72);
          auVar77 = packsswb(auVar77 & auVar80,auVar58);
          if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 8].ref_frame = -1;
          }
          auVar25._4_4_ = auVar71._0_4_;
          auVar25._0_4_ = auVar71._0_4_;
          auVar25._8_4_ = auVar71._8_4_;
          auVar25._12_4_ = auVar71._8_4_;
          auVar88 = auVar87 & auVar25 | auVar88;
          auVar58 = packssdw(auVar88,auVar88);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar58 = packssdw(auVar58 ^ auVar13,auVar58 ^ auVar13);
          auVar77 = packsswb(auVar77,auVar58);
          if ((auVar77._8_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 9].ref_frame = -1;
          }
          auVar77 = (auVar75 | auVar36) ^ auVar33;
          auVar73._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar73._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar73._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar73._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar89._4_4_ = auVar73._0_4_;
          auVar89._0_4_ = auVar73._0_4_;
          auVar89._8_4_ = auVar73._8_4_;
          auVar89._12_4_ = auVar73._8_4_;
          iVar93 = -(uint)(auVar77._4_4_ == iVar49);
          iVar97 = -(uint)(auVar77._12_4_ == iVar79);
          auVar26._4_4_ = iVar93;
          auVar26._0_4_ = iVar93;
          auVar26._8_4_ = iVar97;
          auVar26._12_4_ = iVar97;
          auVar96._4_4_ = auVar73._4_4_;
          auVar96._0_4_ = auVar73._4_4_;
          auVar96._8_4_ = auVar73._12_4_;
          auVar96._12_4_ = auVar73._12_4_;
          auVar77 = auVar26 & auVar89 | auVar96;
          auVar77 = packssdw(auVar77,auVar77);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar14,auVar77 ^ auVar14);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 10].ref_frame = -1;
          }
          auVar77 = pshufhw(auVar77,auVar89,0x84);
          auVar27._4_4_ = iVar93;
          auVar27._0_4_ = iVar93;
          auVar27._8_4_ = iVar97;
          auVar27._12_4_ = iVar97;
          auVar80 = pshufhw(auVar73,auVar27,0x84);
          auVar58 = pshufhw(auVar77,auVar96,0x84);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar58 | auVar80 & auVar77) ^ auVar63;
          auVar77 = packssdw(auVar63,auVar63);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._10_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 0xb].ref_frame = -1;
          }
          auVar77 = (auVar75 | _DAT_004d3fa0) ^ auVar33;
          auVar74._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar74._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar74._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar74._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar28._4_4_ = auVar74._0_4_;
          auVar28._0_4_ = auVar74._0_4_;
          auVar28._8_4_ = auVar74._8_4_;
          auVar28._12_4_ = auVar74._8_4_;
          auVar80 = pshuflw(auVar96,auVar28,0xe8);
          auVar64._0_4_ = -(uint)(auVar77._0_4_ == iVar54);
          auVar64._4_4_ = -(uint)(auVar77._4_4_ == iVar49);
          auVar64._8_4_ = -(uint)(auVar77._8_4_ == iVar52);
          auVar64._12_4_ = -(uint)(auVar77._12_4_ == iVar79);
          auVar90._4_4_ = auVar64._4_4_;
          auVar90._0_4_ = auVar64._4_4_;
          auVar90._8_4_ = auVar64._12_4_;
          auVar90._12_4_ = auVar64._12_4_;
          auVar77 = pshuflw(auVar64,auVar90,0xe8);
          auVar91._4_4_ = auVar74._4_4_;
          auVar91._0_4_ = auVar74._4_4_;
          auVar91._8_4_ = auVar74._12_4_;
          auVar91._12_4_ = auVar74._12_4_;
          auVar58 = pshuflw(auVar74,auVar91,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 & auVar80,(auVar58 | auVar77 & auVar80) ^ auVar15);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 0xc].ref_frame = -1;
          }
          auVar29._4_4_ = auVar74._0_4_;
          auVar29._0_4_ = auVar74._0_4_;
          auVar29._8_4_ = auVar74._8_4_;
          auVar29._12_4_ = auVar74._8_4_;
          auVar91 = auVar90 & auVar29 | auVar91;
          auVar58 = packssdw(auVar91,auVar91);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77,auVar58 ^ auVar16);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77._12_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 0xd].ref_frame = -1;
          }
          auVar77 = (auVar75 | _DAT_004d3f90) ^ auVar33;
          auVar65._0_4_ = -(uint)(iVar54 < auVar77._0_4_);
          auVar65._4_4_ = -(uint)(iVar49 < auVar77._4_4_);
          auVar65._8_4_ = -(uint)(iVar52 < auVar77._8_4_);
          auVar65._12_4_ = -(uint)(iVar79 < auVar77._12_4_);
          auVar92._4_4_ = auVar65._0_4_;
          auVar92._0_4_ = auVar65._0_4_;
          auVar92._8_4_ = auVar65._8_4_;
          auVar92._12_4_ = auVar65._8_4_;
          auVar76._4_4_ = -(uint)(auVar77._4_4_ == iVar49);
          auVar76._12_4_ = -(uint)(auVar77._12_4_ == iVar79);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar78._4_4_ = auVar65._4_4_;
          auVar78._0_4_ = auVar65._4_4_;
          auVar78._8_4_ = auVar65._12_4_;
          auVar78._12_4_ = auVar65._12_4_;
          auVar58 = auVar76 & auVar92 | auVar78;
          auVar77 = packssdw(auVar65,auVar58);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar17,auVar77 ^ auVar17);
          auVar77 = packsswb(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pMVar45[uVar51 + 0xe].ref_frame = -1;
          }
          auVar77 = pshufhw(auVar77,auVar92,0x84);
          in_XMM2 = pshufhw(auVar58,auVar76,0x84);
          in_XMM2 = in_XMM2 & auVar77;
          auVar77 = pshufhw(auVar77,auVar78,0x84);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar66 = (auVar77 | in_XMM2) ^ auVar66;
          auVar77 = packssdw(auVar66,auVar66);
          in_XMM1 = packsswb(auVar77,auVar77);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            pMVar45[uVar51 + 0xf].ref_frame = -1;
          }
          uVar51 = uVar51 + 0x10;
        } while ((uVar43 + 0xf & 0xfffffff0) != uVar51);
      }
      iVar53 = iVar53 + 1;
      pMVar45 = pMVar45 + iVar44;
    } while (iVar53 != iVar42);
  }
  return;
}

Assistant:

void av1_read_mode_info(AV1Decoder *const pbi, DecoderCodingBlock *dcb,
                        aom_reader *r, int x_mis, int y_mis) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mi = xd->mi[0];
  mi->use_intrabc = 0;

  if (frame_is_intra_only(cm)) {
    read_intra_frame_mode_info(cm, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      intra_copy_frame_mvs(cm, xd->mi_row, xd->mi_col, x_mis, y_mis);
  } else {
    read_inter_frame_mode_info(pbi, dcb, r);
    if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
      av1_copy_frame_mvs(cm, mi, xd->mi_row, xd->mi_col, x_mis, y_mis);
  }
}